

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O2

void __thiscall GetNameTest::SubmitPacket(GetNameTest *this,uint8_t *packet,uint32_t length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  uint32_t start;
  char *__format;
  FILE *__stream;
  uint32_t i;
  uint uVar7;
  uint32_t i_1;
  int nb_name_parts;
  uint local_148;
  uint32_t flags;
  uint32_t previous_offset;
  uint32_t tld_offset;
  char text [256];
  
  tld_offset = 0;
  previous_offset = 0;
  nb_name_parts = 0;
  start = 0xc;
  bVar6 = DnsStats::GetTLD(packet,length,0xc,&tld_offset,&previous_offset,&nb_name_parts);
  uVar1 = *(ushort *)(packet + 4);
  uVar2 = *(ushort *)(packet + 6);
  uVar3 = *(ushort *)(packet + 8);
  uVar4 = *(ushort *)(packet + 10);
  if (bVar6) {
    if ((ulong)previous_offset != 0) {
      DnsStats::NormalizeNamePart
                ((uint)packet[previous_offset],packet + (previous_offset + 1),(uint8_t *)text,0x100,
                 &flags);
      fprintf((FILE *)this->test_out,"%s.",text);
    }
    DnsStats::NormalizeNamePart
              ((uint)packet[tld_offset],packet + (tld_offset + 1),(uint8_t *)text,0x100,&flags);
    fputs(text,(FILE *)this->test_out);
    __stream = (FILE *)this->test_out;
    __format = " %d\n";
  }
  else {
    __stream = (FILE *)this->test_out;
    __format = "??? %d\n";
  }
  fprintf(__stream,__format,(ulong)(uint)nb_name_parts);
  local_148 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
  uVar7 = 0;
  while( true ) {
    uVar5 = local_148;
    if ((length <= start) || ((ushort)(uVar1 << 8 | uVar1 >> 8) <= uVar7)) break;
    start = SubmitQuery(this,packet,length,start);
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; (start < length && (uVar7 < uVar5)); uVar7 = uVar7 + 1) {
    start = SubmitRecord(this,packet,length,start);
  }
  for (uVar7 = 0; (start < length && (uVar7 < (ushort)(uVar3 << 8 | uVar3 >> 8))); uVar7 = uVar7 + 1
      ) {
    start = SubmitRecord(this,packet,length,start);
  }
  for (uVar7 = 0; (start < length && (uVar7 < (ushort)(uVar4 << 8 | uVar4 >> 8))); uVar7 = uVar7 + 1
      ) {
    start = SubmitRecord(this,packet,length,start);
  }
  return;
}

Assistant:

void GetNameTest::SubmitPacket(uint8_t * packet, uint32_t length)
{
    uint32_t qdcount = 0;
    uint32_t ancount = 0;
    uint32_t nscount = 0;
    uint32_t arcount = 0;
    uint32_t parse_index = 12;
    uint32_t tld_offset = 0;
    uint32_t previous_offset = 0;
    int nb_name_parts = 0;
    bool gotTld = DnsStats::GetTLD(packet, length, 12, &tld_offset, &previous_offset, &nb_name_parts);

    qdcount = (packet[4] << 8) | packet[5];
    ancount = (packet[6] << 8) | packet[7];
    nscount = (packet[8] << 8) | packet[9];
    arcount = (packet[10] << 8) | packet[11];

    if (gotTld) {
        char text[256];
        uint32_t flags;

        if (previous_offset != 0) {
            (void) DnsStats::NormalizeNamePart(packet[previous_offset],
                &packet[previous_offset + 1], (uint8_t *)text, sizeof(text), &flags);
            fprintf(test_out, "%s.", text);
        }
        (void) DnsStats::NormalizeNamePart(packet[tld_offset],
            &packet[tld_offset + 1], (uint8_t *)text, sizeof(text), &flags);
        fprintf(test_out, "%s", text);

        fprintf(test_out, " %d\n", nb_name_parts);
    }
    else {
        fprintf(test_out, "??? %d\n", nb_name_parts);
    }

    for (uint32_t i = 0; i < qdcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitQuery(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < ancount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < nscount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < arcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }
}